

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O3

void * thread_routine(void *arg_)

{
  int iVar1;
  sigset_t signal_set;
  sigset_t sStack_88;
  
  iVar1 = sigfillset(&sStack_88);
  if (iVar1 != 0) {
    thread_routine();
  }
  iVar1 = pthread_sigmask(0,&sStack_88,(__sigset_t *)0x0);
  if (iVar1 != 0) {
    thread_routine();
  }
  zmq::thread_t::applySchedulingParameters((thread_t *)arg_);
  zmq::thread_t::applyThreadName((thread_t *)arg_);
  (**arg_)(*(undefined8 *)((long)arg_ + 8));
  return (void *)0x0;
}

Assistant:

static void *thread_routine (void *arg_)
{
#if !defined ZMQ_HAVE_OPENVMS && !defined ZMQ_HAVE_ANDROID
    //  Following code will guarantee more predictable latencies as it'll
    //  disallow any signal handling in the I/O thread.
    sigset_t signal_set;
    int rc = sigfillset (&signal_set);
    errno_assert (rc == 0);
    rc = pthread_sigmask (SIG_BLOCK, &signal_set, NULL);
    posix_assert (rc);
#endif
    zmq::thread_t *self = (zmq::thread_t *) arg_;
    self->applySchedulingParameters ();
    self->applyThreadName ();
    self->_tfn (self->_arg);
    return NULL;
}